

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::Type> * __thiscall
capnp::compiler::Compiler::Node::resolveBootstrapType
          (Maybe<capnp::Type> *__return_storage_ptr__,Node *this,Reader type,Schema scope)

{
  int iVar1;
  Exception *params_1;
  StringPtr error;
  NullableValue<kj::Exception> exception;
  RawBrandedSchema *local_308;
  Runnable local_300;
  Maybe<capnp::Type> *local_2f8;
  Node *local_2f0;
  Exception *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 local_2d0;
  NullableValue<kj::Exception> local_178;
  
  local_2e0 = (undefined1 *)&local_308;
  (__return_storage_ptr__->ptr).isSet = false;
  local_300._vptr_Runnable = (_func_int **)&PTR_run_00309320;
  params_1 = (Exception *)&type;
  local_308 = scope.raw;
  local_2f8 = __return_storage_ptr__;
  local_2f0 = this;
  local_2e8 = params_1;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_2d8,&local_300);
  kj::_::NullableValue<kj::Exception>::NullableValue
            (&local_178,(NullableValue<kj::Exception> *)&local_2d8);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_2d8);
  if (local_178.isSet == true) {
    if ((__return_storage_ptr__->ptr).isSet == true) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    iVar1 = (*(this->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
    if ((char)iVar1 == '\0') {
      kj::str<char_const(&)[57],kj::Exception&>
                ((String *)&local_2d8,
                 (kj *)"Internal compiler bug: Bootstrap schema failed to load:\n",
                 (char (*) [57])&local_178.field_1,params_1);
      if (local_2d0.value.ownFile.content.ptr == (char *)0x0) {
        local_2d8 = "";
      }
      error.content.size_ =
           local_2d0.value.ownFile.content.ptr +
           (local_2d0.value.ownFile.content.ptr == (char *)0x0);
      error.content.ptr = local_2d8;
      addError(this,error);
      kj::Array<char>::~Array((Array<char> *)&local_2d8);
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_178);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type> Compiler::Node::resolveBootstrapType(schema::Type::Reader type, Schema scope) {
  // TODO(someday): Arguably should return null if the type or its dependencies are placeholders.

  kj::Maybe<Type> result;
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&]() {
    result = module->getCompiler().getWorkspace().bootstrapLoader.getType(type, scope);
  })) {
    result = nullptr;
    if (!module->getErrorReporter().hadErrors()) {
      addError(kj::str("Internal compiler bug: Bootstrap schema failed to load:\n",
                       *exception));
    }
  }
  return result;
}